

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::CreateFramework(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  long *plVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  bool bVar8;
  undefined8 *puVar9;
  iterator iVar10;
  ulong uVar11;
  undefined8 uVar12;
  string frameworkVersion;
  string newName;
  string newoutpath;
  string plist;
  string contentdir;
  string oldName;
  string versions;
  string name;
  string local_150;
  string local_130;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  string local_f0;
  key_type local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined8 uStack_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  bVar8 = cmTarget::HaveWellDefinedOutputFiles(this->GT->Target);
  if (!bVar8) {
    return;
  }
  if (this->MacContentFolders ==
      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __assert_fail("this->MacContentFolders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmOSXBundleGenerator.cxx"
                  ,0x4c,
                  "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &)"
                 );
  }
  pcVar5 = (outpath->_M_dataplus)._M_p;
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar5,pcVar5 + outpath->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  cmTarget::GetFrameworkDirectory(&local_150,this->GT->Target,&this->ConfigName,true);
  uVar11 = 0xf;
  if (local_110 != &local_100) {
    uVar11 = local_100;
  }
  if (uVar11 < local_150._M_string_length + local_108) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar12 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_150._M_string_length + local_108) goto LAB_0040dfa0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0040dfa0:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150._M_dataplus._M_p);
  }
  local_b0 = &local_a0;
  plVar1 = puVar9 + 2;
  if ((long *)*puVar9 == plVar1) {
    local_a0 = *plVar1;
    uStack_98 = puVar9[3];
  }
  else {
    local_a0 = *plVar1;
    local_b0 = (long *)*puVar9;
  }
  local_a8 = puVar9[1];
  *puVar9 = plVar1;
  puVar9[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  std::__cxx11::string::append((char *)&local_b0);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar5 = (outpath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar5,pcVar5 + outpath->_M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  cmTarget::GetFrameworkDirectory(&local_f0,this->GT->Target,&this->ConfigName,false);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    uVar12 = local_150.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_f0._M_string_length + local_150._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_150._M_string_length <= (ulong)uVar12) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)local_150._M_dataplus._M_p);
      goto LAB_0040e0f9;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
LAB_0040e0f9:
  puVar2 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar2) {
    local_100 = *puVar2;
    uStack_f8 = puVar9[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar2;
    local_110 = (ulong *)*puVar9;
  }
  local_108 = puVar9[1];
  *puVar9 = puVar2;
  puVar9[1] = 0;
  *(undefined1 *)puVar2 = 0;
  paVar3 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  cmTarget::GetFrameworkVersion_abi_cxx11_(&local_150,this->GT->Target);
  this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             *)this->MacContentFolders;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Resources","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_110,(undefined1 *)(local_108 + (long)local_110));
  std::__cxx11::string::append((char *)&local_f0);
  cmsys::SystemTools::GetFilenameName(&local_50,targetName);
  cmLocalGenerator::GenerateFrameworkInfoPList
            (this->LocalGenerator,this->GT->Target,&local_50,local_f0._M_dataplus._M_p);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_70[0] = local_60;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_b0,(undefined1 *)(local_a8 + (long)local_b0));
  std::__cxx11::string::append((char *)local_70);
  cmsys::SystemTools::MakeDirectory((char *)local_70[0]);
  cmsys::SystemTools::MakeDirectory((char *)local_110);
  std::__cxx11::string::_M_assign((string *)&local_90);
  std::__cxx11::string::_M_assign((string *)&local_130);
  std::__cxx11::string::append((char *)&local_130);
  cmsys::SystemTools::RemoveFile(&local_130);
  cmsys::SystemTools::CreateSymlink(&local_90,&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,&local_130);
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x516e7c);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
  std::__cxx11::string::_M_assign((string *)&local_130);
  std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_50._M_dataplus._M_p);
  cmsys::SystemTools::RemoveFile(&local_130);
  cmsys::SystemTools::CreateSymlink(&local_90,&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,&local_130);
  p_Var6 = &this->MacContentFolders->_M_t;
  paVar4 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Resources","");
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(p_Var6,&local_d0);
  psVar7 = this->MacContentFolders;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar10._M_node != &(psVar7->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x516e8e);
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    cmsys::SystemTools::RemoveFile(&local_130);
    cmsys::SystemTools::CreateSymlink(&local_90,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_130);
  }
  p_Var6 = &this->MacContentFolders->_M_t;
  local_d0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Headers","");
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(p_Var6,&local_d0);
  psVar7 = this->MacContentFolders;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar10._M_node != &(psVar7->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x516ea9);
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    cmsys::SystemTools::RemoveFile(&local_130);
    cmsys::SystemTools::CreateSymlink(&local_90,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_130);
  }
  p_Var6 = &this->MacContentFolders->_M_t;
  local_d0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"PrivateHeaders","");
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(p_Var6,&local_d0);
  psVar7 = this->MacContentFolders;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar10._M_node != &(psVar7->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x516ec2);
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    cmsys::SystemTools::RemoveFile(&local_130);
    cmsys::SystemTools::CreateSymlink(&local_90,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_130);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath)
{
  if (this->MustSkip())
    return;

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = outpath + "/" +
    this->GT->Target->GetFrameworkDirectory(this->ConfigName, true);
  contentdir += "/";

  std::string newoutpath = outpath + "/" +
    this->GT->Target->GetFrameworkDirectory(this->ConfigName, false);

  std::string frameworkVersion = this->GT->Target->GetFrameworkVersion();

  // Configure the Info.plist file into the Resources directory.
  this->MacContentFolders->insert("Resources");
  std::string plist = newoutpath;
  plist += "/Resources/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateFrameworkInfoPList(this->GT->Target,
                                                   name,
                                                   plist.c_str());

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;


  // Make foo.framework/Versions
  std::string versions = contentdir;
  versions += "Versions";
  cmSystemTools::MakeDirectory(versions.c_str());

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath.c_str());

  // Current -> version
  oldName = frameworkVersion;
  newName = versions;
  newName += "/Current";
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = "Versions/Current/";
  oldName += name;
  newName = contentdir;
  newName += name;
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if(this->MacContentFolders->find("Resources") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Resources";
    newName = contentdir;
    newName += "Resources";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // Headers -> Versions/Current/Headers
  if(this->MacContentFolders->find("Headers") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Headers";
    newName = contentdir;
    newName += "Headers";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if(this->MacContentFolders->find("PrivateHeaders") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/PrivateHeaders";
    newName = contentdir;
    newName += "PrivateHeaders";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }
}